

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qownlanguagedata.cpp
# Opt level: O1

void loadJSData(QMultiHash<char,_QLatin1String> *types,QMultiHash<char,_QLatin1String> *keywords,
               QMultiHash<char,_QLatin1String> *builtin,QMultiHash<char,_QLatin1String> *literals,
               QMultiHash<char,_QLatin1String> *other)

{
  if (JSDataInitialized == '\0') {
    initJSData();
    JSDataInitialized = '\x01';
  }
  QMultiHash<char,_QLatin1String>::operator=(types,&js_types);
  QMultiHash<char,_QLatin1String>::operator=(keywords,&js_keywords);
  QMultiHash<char,_QLatin1String>::operator=(builtin,&js_builtin);
  QMultiHash<char,_QLatin1String>::operator=(literals,&js_literals);
  QMultiHash<char,_QLatin1String>::operator=(other,&js_other);
  return;
}

Assistant:

void loadJSData(QMultiHash<char, QLatin1String> &types,
                QMultiHash<char, QLatin1String> &keywords,
                QMultiHash<char, QLatin1String> &builtin,
                QMultiHash<char, QLatin1String> &literals,
                QMultiHash<char, QLatin1String> &other) {
    if (!JSDataInitialized) {
        initJSData();
        JSDataInitialized = true;
    }
    types = js_types;
    keywords = js_keywords;
    builtin = js_builtin;
    literals = js_literals;
    other = js_other;
}